

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O0

void __thiscall
helics::Filter::Filter
          (Filter *this,InterfaceVisibility locality,Federate *ffed,string_view filtName)

{
  string_view actName;
  string_view inputType;
  string_view filterName;
  string_view outputType;
  string_view filterName_00;
  string_view outputType_00;
  InterfaceHandle IVar1;
  Filter *pFVar2;
  size_t in_RCX;
  Federate *in_RDX;
  int in_ESI;
  char *in_RDI;
  char *pcVar3;
  char *in_R8;
  Federate *in_stack_ffffffffffffff20;
  Interface *in_stack_ffffffffffffff28;
  InterfaceHandle in_stack_ffffffffffffff44;
  size_t in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  Federate *in_stack_ffffffffffffff90;
  string_view in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  InterfaceHandle local_2c;
  Federate *local_28;
  int local_1c;
  size_t local_10;
  char *pcStack_8;
  
  local_28 = in_RDX;
  local_1c = in_ESI;
  local_10 = in_RCX;
  pcStack_8 = in_R8;
  memset(&local_2c,0,4);
  InterfaceHandle::InterfaceHandle(&local_2c);
  actName._M_str = in_RDI;
  actName._M_len = (size_t)in_RDX;
  Interface::Interface
            (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff44,actName);
  *(undefined ***)in_RDI = &PTR__Filter_009502c0;
  in_RDI[0x38] = '\0';
  in_RDI[0x39] = '\0';
  pcVar3 = in_RDI + 0x40;
  std::shared_ptr<helics::FilterOperations>::shared_ptr
            ((shared_ptr<helics::FilterOperations> *)0x3109f8);
  if (local_28 != (Federate *)0x0) {
    if (local_1c == 1) {
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffff98);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffff88);
      filterName._M_str = in_stack_ffffffffffffff50;
      filterName._M_len = in_stack_ffffffffffffff48;
      inputType._M_str._0_4_ = (int)pcVar3;
      inputType._M_len = (size_t)in_RDI;
      inputType._M_str._4_4_ = (int)((ulong)pcVar3 >> 0x20);
      outputType._M_str = in_stack_ffffffffffffff68;
      outputType._M_len = (size_t)in_stack_ffffffffffffff60;
      pFVar2 = Federate::registerGlobalFilter(in_RDX,filterName,inputType,outputType);
      IVar1 = Interface::operator_cast_to_InterfaceHandle(&pFVar2->super_Interface);
      *(BaseType *)(in_RDI + 0x10) = IVar1.hid;
    }
    else {
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffff58);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffff48);
      filterName_00._M_str = in_stack_ffffffffffffffb0;
      filterName_00._M_len = in_stack_ffffffffffffffa8;
      outputType_00._M_str = pcStack_8;
      outputType_00._M_len = local_10;
      pFVar2 = Federate::registerFilter
                         (in_stack_ffffffffffffff90,filterName_00,in_stack_ffffffffffffff98,
                          outputType_00);
      IVar1 = Interface::operator_cast_to_InterfaceHandle(&pFVar2->super_Interface);
      *(BaseType *)(in_RDI + 0x10) = IVar1.hid;
    }
  }
  return;
}

Assistant:

Filter::Filter(InterfaceVisibility locality, Federate* ffed, std::string_view filtName):
    Interface(ffed, InterfaceHandle(), filtName)
{
    if (ffed != nullptr) {
        if (locality == InterfaceVisibility::GLOBAL) {
            handle = ffed->registerGlobalFilter(filtName);
        } else {
            handle = ffed->registerFilter(filtName);
        }
    }
}